

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<8,_2,_13,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  int row;
  long lVar3;
  long lVar4;
  undefined4 uVar5;
  Vector<float,_3> res_3;
  Vector<float,_3> res_4;
  Vector<float,_3> res_5;
  Vector<float,_3> res_2;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Mat4 m;
  float afStack_1c0 [6];
  float local_1a8 [4];
  float local_198 [4];
  float local_188 [2];
  ulong local_180;
  undefined4 local_178;
  float local_170 [4];
  float local_160 [4];
  float local_150 [6];
  Matrix<float,_4,_4> local_138;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Matrix<float,_4,_4> local_b8;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  puVar1 = &local_78;
  lVar2 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      uVar5 = 0x3f800000;
      if (lVar2 != lVar4) {
        uVar5 = 0;
      }
      *(undefined4 *)((long)puVar1 + lVar4) = uVar5;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    lVar2 = lVar2 + 0x10;
  } while (lVar3 != 4);
  local_78 = *(undefined8 *)evalCtx->in[0].m_data;
  uStack_70 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
  local_68 = *(undefined8 *)evalCtx->in[1].m_data;
  uStack_60 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  local_58 = *(undefined8 *)evalCtx->in[2].m_data;
  uStack_50 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  local_48 = *(undefined8 *)evalCtx->in[3].m_data;
  uStack_40 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  afStack_1c0[0] = 4.418011e-39;
  afStack_1c0[1] = 0.0;
  decrement<float,4,4>(&local_b8,(MatrixCaseUtils *)&local_78,(Matrix<float,_4,_4> *)0x4);
  local_188[0] = local_b8.m_data.m_data[0].m_data[0];
  local_188[1] = local_b8.m_data.m_data[0].m_data[1];
  local_180 = CONCAT44(local_180._4_4_,local_b8.m_data.m_data[0].m_data[2]);
  afStack_1c0[2] = local_b8.m_data.m_data[1].m_data[1];
  afStack_1c0[3] = local_b8.m_data.m_data[1].m_data[2];
  afStack_1c0[4] = local_b8.m_data.m_data[1].m_data[3];
  local_f8 = 0;
  uStack_f0 = (ulong)uStack_f0._4_4_ << 0x20;
  lVar2 = 0;
  do {
    *(float *)((long)&local_f8 + lVar2 * 4) = local_188[lVar2] + afStack_1c0[lVar2 + 2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_198[0] = local_b8.m_data.m_data[2].m_data[2];
  local_198[1] = local_b8.m_data.m_data[2].m_data[3];
  local_198[2] = local_b8.m_data.m_data[2].m_data[0];
  local_138.m_data.m_data[0].m_data[0] = 0.0;
  local_138.m_data.m_data[0].m_data[1] = 0.0;
  local_138.m_data.m_data[0].m_data[2] = 0.0;
  lVar2 = 0;
  do {
    local_138.m_data.m_data[0].m_data[lVar2] =
         *(float *)((long)&local_f8 + lVar2 * 4) + local_198[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_1a8[0] = local_b8.m_data.m_data[3].m_data[3];
  local_1a8[1] = local_b8.m_data.m_data[3].m_data[0];
  local_1a8[2] = local_b8.m_data.m_data[3].m_data[1];
  local_160[0] = 0.0;
  local_160[1] = 0.0;
  local_160[2] = 0.0;
  lVar2 = 0;
  do {
    local_160[lVar2] = local_138.m_data.m_data[0].m_data[lVar2] + local_1a8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  puVar1 = &local_f8;
  lVar2 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      uVar5 = 0x3f800000;
      if (lVar2 != lVar4) {
        uVar5 = 0;
      }
      *(undefined4 *)((long)puVar1 + lVar4) = uVar5;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    lVar2 = lVar2 + 0x10;
  } while (lVar3 != 4);
  local_f8 = *(undefined8 *)evalCtx->in[0].m_data;
  uStack_f0 = *(long *)(evalCtx->in[0].m_data + 2);
  local_e8 = *(undefined8 *)evalCtx->in[1].m_data;
  uStack_e0 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  local_d8 = *(undefined8 *)evalCtx->in[2].m_data;
  uStack_d0 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  local_c8 = *(undefined8 *)evalCtx->in[3].m_data;
  uStack_c0 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  afStack_1c0[0] = 4.418556e-39;
  afStack_1c0[1] = 0.0;
  decrement<float,4,4>(&local_138,(MatrixCaseUtils *)&local_f8,(Matrix<float,_4,_4> *)0x4);
  local_198[0] = local_138.m_data.m_data[0].m_data[0];
  local_198[1] = local_138.m_data.m_data[0].m_data[1];
  local_198[2] = local_138.m_data.m_data[0].m_data[2];
  local_1a8[0] = local_138.m_data.m_data[1].m_data[1];
  local_1a8[1] = local_138.m_data.m_data[1].m_data[2];
  local_1a8[2] = local_138.m_data.m_data[1].m_data[3];
  afStack_1c0[2] = 0.0;
  afStack_1c0[3] = 0.0;
  afStack_1c0[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_1c0[lVar2 + 2] = local_198[lVar2] + local_1a8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_150[0] = local_138.m_data.m_data[2].m_data[2];
  local_150[1] = local_138.m_data.m_data[2].m_data[3];
  local_150[2] = local_138.m_data.m_data[2].m_data[0];
  local_188[0] = 0.0;
  local_188[1] = 0.0;
  local_180 = local_180 & 0xffffffff00000000;
  lVar2 = 0;
  do {
    local_188[lVar2] = afStack_1c0[lVar2 + 2] + local_150[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_150[3] = local_138.m_data.m_data[3].m_data[3];
  local_150[4] = local_138.m_data.m_data[3].m_data[0];
  local_150[5] = local_138.m_data.m_data[3].m_data[1];
  local_170[0] = 0.0;
  local_170[1] = 0.0;
  local_170[2] = 0.0;
  lVar2 = 0;
  do {
    local_170[lVar2] = local_188[lVar2] + local_150[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_1c0[2] = 0.0;
  afStack_1c0[3] = 0.0;
  afStack_1c0[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_1c0[lVar2 + 2] = local_160[lVar2] + local_170[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_180 = 0x100000000;
  local_178 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_188[lVar2]] = afStack_1c0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0))) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}